

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenerator::Logger::ErrorCommand
          (Logger *this,GenT genType,string_view message,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *command,string *output)

{
  basic_string_view<char,_std::char_traits<char>_> *args;
  char *pcVar1;
  size_t sVar2;
  lock_guard<std::mutex> lock;
  char *pcVar3;
  string_view title;
  string_view title_00;
  string_view title_01;
  string local_168;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  string msg;
  string_view message_local;
  cmAlphaNum local_b8;
  cmAlphaNum local_88;
  char *local_58;
  string local_50;
  
  pcVar3 = message._M_str;
  sVar2 = message._M_len;
  local_b8.View_._M_str = local_b8.Digits_;
  local_b8.View_._M_len = 1;
  local_b8.Digits_[0] = '\n';
  pcVar1 = pcVar3;
  message_local._M_len = sVar2;
  message_local._M_str = pcVar3;
  local_118.View_ = cmQtAutoGen::GeneratorName(genType);
  local_148.View_._M_len = (size_t)&DAT_00000011;
  local_148.View_._M_str = " subprocess error";
  cmStrCat<>(&local_50,&local_118,&local_148);
  title._M_str = pcVar1;
  title._M_len = (size_t)local_50._M_dataplus._M_p;
  HeadLine_abi_cxx11_(&local_168,(Logger *)local_50._M_string_length,title);
  local_88.View_._M_len = local_168._M_string_length;
  local_88.View_._M_str = local_168._M_dataplus._M_p;
  if (sVar2 == 0) {
    local_58 = "\n\n";
  }
  else {
    local_58 = "\n\n";
    if (pcVar3[sVar2 - 1] == '\n') {
      local_58 = "\n";
    }
  }
  args = &message_local;
  cmStrCat<std::basic_string_view<char,std::char_traits<char>>,char_const*>
            (&msg,&local_b8,&local_88,args,&local_58);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_50);
  title_00._M_str = (char *)args;
  title_00._M_len = (size_t)"Command";
  HeadLine_abi_cxx11_((string *)&local_148,(Logger *)0x7,title_00);
  local_b8.View_._M_len = (size_t)local_148.View_._M_str;
  local_b8.View_._M_str = (char *)local_148.View_._M_len;
  cmQtAutoGen::QuotedCommand(&local_168,command);
  local_88.View_._M_len = local_168._M_string_length;
  local_88.View_._M_str = local_168._M_dataplus._M_p;
  pcVar3 = "\n\n";
  pcVar1 = "\n\n";
  cmStrCat<char[3]>((string *)&local_118,&local_b8,&local_88,(char (*) [3])0x5c20d7);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  title_01._M_str = pcVar1;
  title_01._M_len = (size_t)"Output";
  HeadLine_abi_cxx11_((string *)&local_148,(Logger *)&DAT_00000006,title_01);
  local_b8.View_._M_len = (size_t)local_148.View_._M_str;
  local_b8.View_._M_str = (char *)local_148.View_._M_len;
  local_88.View_._M_str = (output->_M_dataplus)._M_p;
  local_88.View_._M_len = output->_M_string_length;
  if ((local_88.View_._M_len != 0) &&
     (pcVar3 = "\n\n", local_88.View_._M_str[local_88.View_._M_len - 1] == '\n')) {
    pcVar3 = "\n";
  }
  local_168._M_dataplus._M_p = pcVar3;
  cmStrCat<char_const*>((string *)&local_118,&local_b8,&local_88,(char **)&local_168);
  std::__cxx11::string::append((string *)&msg);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_148);
  std::mutex::lock(&this->Mutex_);
  cmSystemTools::Stderr(&msg);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::ErrorCommand(
  GenT genType, cm::string_view message,
  std::vector<std::string> const& command, std::string const& output) const
{
  std::string msg = cmStrCat(
    '\n', HeadLine(cmStrCat(GeneratorName(genType), " subprocess error")),
    message, cmHasSuffix(message, '\n') ? "\n" : "\n\n");
  msg += cmStrCat(HeadLine("Command"), QuotedCommand(command), "\n\n");
  msg += cmStrCat(HeadLine("Output"), output,
                  cmHasSuffix(output, '\n') ? "\n" : "\n\n");
  {
    std::lock_guard<std::mutex> lock(this->Mutex_);
    cmSystemTools::Stderr(msg);
  }
}